

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang,string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *this_00;
  cmTarget *pcVar1;
  bool bVar2;
  char *pcVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  pointer pbVar6;
  allocator local_239;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  cmTarget *local_1f0;
  string *local_1e8;
  _Rb_tree_node_base *local_1e0;
  char *local_1d8;
  _Rb_tree_node_base *local_1d0;
  string langFlagRegexVar;
  RegularExpression r;
  
  std::__cxx11::string::string((string *)&local_210,"CMAKE_",(allocator *)&features);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,&local_210,
                 lang);
  std::operator+(&langFlagRegexVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                 "_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&local_210);
  pcVar3 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  local_1f0 = target;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string((string *)&r,"COMPILE_FLAGS",(allocator *)&local_210);
    pcVar3 = cmTarget::GetProperty(target,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
    if (pcVar3 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar3);
    }
    r.startp[0] = (char *)0x0;
    r.startp[1] = (char *)0x0;
    r.startp[2] = (char *)0x0;
    cmTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&r,config,lang);
    for (pcVar3 = r.startp[0]; pcVar3 != r.startp[1]; pcVar3 = pcVar3 + 0x20) {
      (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&r);
  }
  else {
    cmsys::RegularExpression::RegularExpression(&r,pcVar3);
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_210,"COMPILE_FLAGS",&local_239);
    pcVar3 = cmTarget::GetProperty(target,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    if (pcVar3 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar3,&features);
    }
    cmTarget::GetCompileOptions(target,&features,config,lang);
    for (pbVar6 = features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      bVar2 = cmsys::RegularExpression::find(&r,(pbVar6->_M_dataplus)._M_p);
      if (bVar2) {
        (*this->_vptr_cmLocalGenerator[7])(this,flags,pbVar6);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&features);
    cmsys::RegularExpression::~RegularExpression(&r);
    target = local_1f0;
  }
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmTarget::GetCompileFeatures(target,&features,config);
  pbVar6 = features.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar6 == features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var4 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1d0 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1e8 = lang;
      goto LAB_0032d512;
    }
    bVar2 = cmMakefile::AddRequiredTargetFeature(this->Makefile,target,pbVar6,(string *)0x0);
    pbVar6 = pbVar6 + 1;
  } while (bVar2);
LAB_0032d6bb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&features);
  std::__cxx11::string::~string((string *)&langFlagRegexVar);
  return;
LAB_0032d512:
  if (p_Var4 == local_1d0) goto LAB_0032d5ad;
  __lhs = p_Var4 + 1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 "_STANDARD");
  pcVar3 = cmTarget::GetProperty(target,(string *)&r);
  std::__cxx11::string::~string((string *)&r);
  if (pcVar3 != (char *)0x0) {
    this_00 = this->Makefile;
    local_1d8 = pcVar3;
    std::__cxx11::string::string((string *)&r,pcVar3,(allocator *)&local_210);
    local_1e0 = p_Var4 + 2;
    bVar2 = cmMakefile::IsLaterStandard(this_00,(string *)__lhs,(string *)&r,(string *)local_1e0);
    std::__cxx11::string::~string((string *)&r);
    pcVar1 = local_1f0;
    target = local_1f0;
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
      poVar5 = std::operator<<((ostream *)&r,"The COMPILE_FEATURES property of target \"");
      pcVar3 = local_1d8;
      poVar5 = std::operator<<(poVar5,(string *)&pcVar1->Name);
      poVar5 = std::operator<<(poVar5,
                               "\" was evaluated when computing the link implementation, and the \""
                              );
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"_STANDARD\" was \"");
      poVar5 = std::operator<<(poVar5,(string *)local_1e0);
      poVar5 = std::operator<<(poVar5,
                               "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                              );
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"_STANDARD\" \"");
      poVar5 = std::operator<<(poVar5,pcVar3);
      poVar5 = std::operator<<(poVar5,
                               "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&r);
      goto LAB_0032d6bb;
    }
  }
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  goto LAB_0032d512;
LAB_0032d5ad:
  AddCompilerRequirementFlag(this,flags,target,local_1e8);
  goto LAB_0032d6bb;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(
  std::string& flags, cmTarget* target,
  const std::string& lang, const std::string& config
  )
{
  std::string langFlagRegexVar = std::string("CMAKE_")+lang+"_FLAG_REGEX";
  if(const char* langFlagRegexStr =
     this->Makefile->GetDefinition(langFlagRegexVar))
    {
    // Filter flags acceptable to this language.
    cmsys::RegularExpression r(langFlagRegexStr);
    std::vector<std::string> opts;
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
      }
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      if(r.find(i->c_str()))
        {
        // (Re-)Escape this flag.  COMPILE_FLAGS were already parsed
        // as a command line above, and COMPILE_OPTIONS are escaped.
        this->AppendFlagEscape(flags, *i);
        }
      }
    }
  else
    {
    // Use all flags.
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
      }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      // COMPILE_OPTIONS are escaped.
      this->AppendFlagEscape(flags, *i);
      }
    }
  std::vector<std::string> features;
  target->GetCompileFeatures(features, config);
  for(std::vector<std::string>::const_iterator it = features.begin();
      it != features.end(); ++it)
    {
     if (!this->Makefile->AddRequiredTargetFeature(target, *it))
      {
      return;
      }
    }

  for(std::map<std::string, std::string>::const_iterator it
      = target->GetMaxLanguageStandards().begin();
      it != target->GetMaxLanguageStandards().end(); ++it)
    {
    const char* standard = target->GetProperty(it->first + "_STANDARD");
    if(!standard)
      {
      continue;
      }
    if (this->Makefile->IsLaterStandard(it->first, standard, it->second))
      {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \""
        << target->GetName() << "\" was evaluated when computing the link "
        "implementation, and the \"" << it->first << "_STANDARD\" was \""
        << it->second << "\" for that computation.  Computing the "
        "COMPILE_FEATURES based on the link implementation resulted in a "
        "higher \"" << it->first << "_STANDARD\" \"" << standard << "\".  "
        "This is not permitted. The COMPILE_FEATURES may not both depend on "
        "and be depended on by the link implementation." << std::endl;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    }
  this->AddCompilerRequirementFlag(flags, target, lang);
}